

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O0

bool_t xdr_enum(XDR *__xdrs,enum_t *__ep)

{
  xdr_op xVar1;
  undefined7 extraout_var;
  ulong uVar2;
  undefined7 extraout_var_00;
  enum_t *ep_local;
  XDR *xdrs_local;
  
  xVar1 = __xdrs[2].x_op;
  if (xVar1 == XDR_ENCODE) {
    xdrs_local._7_1_ = xdr_putenum((XDR *)__xdrs,*__ep);
    uVar2 = CONCAT71(extraout_var,xdrs_local._7_1_);
  }
  else if (xVar1 == XDR_DECODE) {
    xdrs_local._7_1_ = xdr_getenum((XDR *)__xdrs,__ep);
    uVar2 = CONCAT71(extraout_var_00,xdrs_local._7_1_);
  }
  else {
    uVar2 = (ulong)(xVar1 - XDR_FREE);
    if (xVar1 - XDR_FREE == 0) {
      xdrs_local._7_1_ = true;
    }
    else {
      xdrs_local._7_1_ = false;
    }
  }
  return (bool_t)CONCAT71((int7)(uVar2 >> 8),xdrs_local._7_1_);
}

Assistant:

static inline bool
xdr_enum(XDR *xdrs, enum_t *ep)
{
	switch (xdrs->x_op) {

	case XDR_ENCODE:
		return (xdr_putenum(xdrs, *ep));

	case XDR_DECODE:
		return (xdr_getenum(xdrs, ep));

	case XDR_FREE:
		return (true);
	}
	/* NOTREACHED */
	return (false);
}